

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cc
# Opt level: O0

Expression __thiscall cnn::GRUBuilder::add_input_impl(GRUBuilder *this,int prev,Expression *x)

{
  size_type sVar1;
  reference this_00;
  int in_EDX;
  undefined8 extraout_RDX;
  long in_RSI;
  ComputationGraph *in_RDI;
  double __x;
  double __x_00;
  Expression EVar2;
  Expression crt;
  Expression nwt_1;
  Expression ght;
  Expression nwt;
  Expression ct;
  Expression rt;
  Expression ft;
  Expression zt;
  bool prev_zero;
  Expression h_tprev;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *vars;
  uint i;
  Expression in;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *ht;
  bool has_initial_state;
  initializer_list<cnn::expr::Expression> *in_stack_fffffffffffffbd8;
  Expression *in_stack_fffffffffffffbe0;
  allocator_type *in_stack_fffffffffffffbf0;
  size_type in_stack_fffffffffffffbf8;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_stack_fffffffffffffc00;
  Expression *in_stack_fffffffffffffc10;
  Expression *in_stack_fffffffffffffc18;
  expr local_378 [16];
  undefined1 local_368 [16];
  initializer_list<cnn::expr::Expression> aiStack_358 [2];
  Expression aEStack_338 [2];
  undefined1 *local_318;
  undefined8 local_310;
  expr local_2d8 [16];
  undefined1 local_2c8 [48];
  undefined1 *local_298;
  undefined8 local_290;
  undefined1 local_258 [80];
  undefined1 *local_208;
  undefined8 local_200;
  undefined1 local_1e8 [48];
  undefined1 *local_1b8;
  undefined8 local_1b0;
  undefined1 local_168 [48];
  Expression aEStack_138 [2];
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 local_f8 [16];
  Expression aEStack_e8 [2];
  undefined1 *local_c8;
  undefined8 local_c0;
  byte local_91;
  reference local_80;
  uint local_74;
  reference local_60;
  byte local_21;
  int local_14;
  
  local_14 = in_EDX;
  sVar1 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size
                    ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                     (in_RSI + 0x70));
  local_21 = sVar1 != 0;
  std::allocator<cnn::expr::Expression>::allocator((allocator<cnn::expr::Expression> *)0x5e7c45);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::push_back((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               *)in_stack_fffffffffffffbe0,(value_type *)in_stack_fffffffffffffbd8);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_fffffffffffffbf0);
  std::allocator<cnn::expr::Expression>::~allocator((allocator<cnn::expr::Expression> *)0x5e7c8c);
  local_60 = std::
             vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
             ::back((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     *)in_stack_fffffffffffffbe0);
  cnn::expr::Expression::Expression
            (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
  for (local_74 = 0; local_74 < *(uint *)(in_RSI + 0x8c); local_74 = local_74 + 1) {
    local_80 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[]((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                             *)(in_RSI + 0x40),(ulong)local_74);
    cnn::expr::Expression::Expression((Expression *)0x5e7d06);
    local_91 = 0;
    if ((local_14 < 0) && ((local_21 & 1) == 0)) {
      local_91 = 1;
    }
    else {
      if (local_14 < 0) {
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                   (in_RSI + 0x70),(ulong)local_74);
      }
      else {
        this_00 = std::
                  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                  ::operator[]((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                *)(in_RSI + 0x58),(long)local_14);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (this_00,(ulong)local_74);
      }
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
    }
    cnn::expr::Expression::Expression((Expression *)0x5e7dec);
    if ((local_91 & 1) == 0) {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_80,2);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_80,0);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      in_stack_fffffffffffffc10 = aEStack_138;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_80,1);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      local_118 = local_168;
      local_110 = 5;
      cnn::expr::affine_transform(in_stack_fffffffffffffbd8);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
    }
    else {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_80,2);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      in_stack_fffffffffffffc18 = aEStack_e8;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_80,0);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      local_c8 = local_f8;
      local_c0 = 3;
      cnn::expr::affine_transform(in_stack_fffffffffffffbd8);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
    }
    cnn::expr::logistic(in_stack_fffffffffffffc18);
    cnn::expr::Expression::operator=
              (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
    cnn::expr::operator-((real)((ulong)in_stack_fffffffffffffc18 >> 0x20),in_stack_fffffffffffffc10)
    ;
    cnn::expr::Expression::Expression((Expression *)0x5e7ffc);
    if ((local_91 & 1) == 0) {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_80,5);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_80,3);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_80,4);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      local_208 = local_258;
      local_200 = 5;
      cnn::expr::affine_transform(in_stack_fffffffffffffbd8);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
    }
    else {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_80,5);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_80,3);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      local_1b8 = local_1e8;
      local_1b0 = 3;
      cnn::expr::affine_transform(in_stack_fffffffffffffbd8);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
    }
    cnn::expr::logistic(in_stack_fffffffffffffc18);
    cnn::expr::Expression::operator=
              (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
    cnn::expr::Expression::Expression((Expression *)0x5e81f1);
    if ((local_91 & 1) == 0) {
      cnn::expr::cwise_multiply(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_80,8);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      in_stack_fffffffffffffbd8 = aiStack_358;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_80,6);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      in_stack_fffffffffffffbe0 = aEStack_338;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_80,7);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      local_318 = local_368;
      local_310 = 5;
      cnn::expr::affine_transform(in_stack_fffffffffffffbd8);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      cnn::expr::tanh(local_378,__x_00);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      cnn::expr::cwise_multiply(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      cnn::expr::cwise_multiply(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      cnn::expr::operator+(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_60,(ulong)local_74);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
    }
    else {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_80,8);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_80,6);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      local_298 = local_2c8;
      local_290 = 3;
      cnn::expr::affine_transform(in_stack_fffffffffffffbd8);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      cnn::expr::tanh(local_2d8,__x);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      cnn::expr::cwise_multiply(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_60,(ulong)local_74);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
    }
  }
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::back
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_fffffffffffffbe0);
  cnn::expr::Expression::Expression
            (in_stack_fffffffffffffbe0,(Expression *)in_stack_fffffffffffffbd8);
  EVar2._8_8_ = extraout_RDX;
  EVar2.pg = in_RDI;
  return EVar2;
}

Assistant:

Expression GRUBuilder::add_input_impl(int prev, const Expression& x) {
  const bool has_initial_state = (h0.size() > 0);
  h.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    Expression h_tprev;
    // prev_zero means that h_tprev should be treated as 0
    bool prev_zero = false;
    if (prev >= 0 || has_initial_state) {
      h_tprev = (prev < 0) ? h0[i] : h[prev][i];
    } else { prev_zero = true; }
    // update gate
    Expression zt;
    if (prev_zero)
      zt = affine_transform({vars[BZ], vars[X2Z], in});
    else
      zt = affine_transform({vars[BZ], vars[X2Z], in, vars[H2Z], h_tprev});
    zt = logistic(zt);
    // forget
    Expression ft = 1.f - zt;
    // reset gate
    Expression rt;
    if (prev_zero)
      rt = affine_transform({vars[BR], vars[X2R], in});
    else
      rt = affine_transform({vars[BR], vars[X2R], in, vars[H2R], h_tprev});
    rt = logistic(rt);

    // candidate activation
    Expression ct;
    if (prev_zero) {
      ct = affine_transform({vars[BH], vars[X2H], in});
      ct = tanh(ct);
      Expression nwt = cwise_multiply(zt, ct);
      in = ht[i] = nwt;
    } else {
      Expression ght = cwise_multiply(rt, h_tprev);
      ct = affine_transform({vars[BH], vars[X2H], in, vars[H2H], ght});
      ct = tanh(ct);
      Expression nwt = cwise_multiply(zt, ct);
      Expression crt = cwise_multiply(ft, h_tprev);
      in = ht[i] = crt + nwt;
    }
  }
  return ht.back();
}